

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createVectorExtractDynamic(Builder *this,Id vector,Id typeId,Id componentIndex)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *extract;
  Id local_18;
  Id componentIndex_local;
  Id typeId_local;
  Id vector_local;
  Builder *this_local;
  
  extract._4_4_ = componentIndex;
  local_18 = typeId;
  componentIndex_local = vector;
  _typeId_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,local_18,OpVectorExtractDynamic);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,2);
  spv::Instruction::addIdOperand(local_28,componentIndex_local);
  spv::Instruction::addIdOperand(local_28,extract._4_4_);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  addInstruction(this,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  IVar1 = spv::Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createVectorExtractDynamic(Id vector, Id typeId, Id componentIndex)
{
    Instruction* extract = new Instruction(getUniqueId(), typeId, OpVectorExtractDynamic);
    extract->reserveOperands(2);
    extract->addIdOperand(vector);
    extract->addIdOperand(componentIndex);
    addInstruction(std::unique_ptr<Instruction>(extract));

    return extract->getResultId();
}